

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O0

void __thiscall gui::Slider::setValue(Slider *this,float value)

{
  float *pfVar1;
  long in_RDI;
  float in_XMM0_Da;
  float newValue;
  Widget *in_stack_00000018;
  Signal<gui::Widget_*,_float> *in_stack_00000020;
  float fVar2;
  
  pfVar1 = std::max<float>((float *)&stack0xfffffffffffffff4,(float *)(in_RDI + 0x248));
  pfVar1 = std::min<float>(pfVar1,(float *)(in_RDI + 0x24c));
  fVar2 = *pfVar1;
  if ((fVar2 != *(float *)(in_RDI + 0x250)) || (NAN(fVar2) || NAN(*(float *)(in_RDI + 0x250)))) {
    *(float *)(in_RDI + 0x250) = fVar2;
    Signal<gui::Widget_*,_float>::emit(in_stack_00000020,in_stack_00000018,this._4_4_);
    Widget::requestRedraw((Widget *)CONCAT44(in_XMM0_Da,fVar2));
  }
  return;
}

Assistant:

void Slider::setValue(float value) {
    float newValue = std::min(std::max(value, range_.first), range_.second);
    if (newValue != value_) {
        value_ = newValue;
        onValueChange.emit(this, newValue);
        requestRedraw();
    }
}